

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_internal(parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *this,bool keep,
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  lexer_t *plVar3;
  number_float_t nVar4;
  bool bVar5;
  bool bVar6;
  token_type tVar7;
  json_value jVar8;
  object_t *poVar9;
  array_t *paVar10;
  out_of_range *__return_storage_ptr__;
  long *plVar11;
  pointer *ppbVar12;
  size_type *psVar13;
  int iVar14;
  string key;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  k;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  value;
  parse_event_t local_c1;
  undefined1 local_c0 [8];
  json_value local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  uint local_9c;
  json_value *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_6c;
  undefined1 local_68 [8];
  json_value local_60;
  _Any_data *local_48;
  json_value *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  if (this->errored == true) {
    __assert_fail("not errored",
                  "/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/json.hpp",
                  0xbb4,
                  "void nlohmann::detail::parser<nlohmann::basic_json<>>::parse_internal(bool, BasicJsonType &) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  if (result->m_type != discarded) {
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
    result->m_type = discarded;
  }
  switch(this->last_token) {
  case literal_true:
    result->m_type = boolean;
    (result->m_value).number_integer = 1;
    break;
  case literal_false:
    result->m_type = boolean;
    (result->m_value).object = (object_t *)0x0;
    break;
  case literal_null:
    result->m_type = null;
    break;
  case value_string:
    result->m_type = string;
    local_c0 = (undefined1  [8])(this->m_lexer).yytext._M_dataplus._M_p;
    paVar1 = &(this->m_lexer).yytext.field_2;
    if (local_c0 == (undefined1  [8])paVar1) {
      local_b0._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_b0._8_8_ = *(long *)((long)&(this->m_lexer).yytext.field_2 + 8);
      local_c0 = (undefined1  [8])(local_c0 + 0x10);
    }
    else {
      local_b0._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_b8 = (json_value)(this->m_lexer).yytext._M_string_length;
    (this->m_lexer).yytext._M_dataplus._M_p = (pointer)paVar1;
    (this->m_lexer).yytext._M_string_length = 0;
    (this->m_lexer).yytext.field_2._M_local_buf[0] = '\0';
    jVar8.object = (object_t *)operator_new(0x20);
    ppbVar12 = &((jVar8.array)->
                super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
    ((jVar8.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar12;
    if (local_c0 == (undefined1  [8])(local_c0 + 0x10)) {
      *ppbVar12 = (pointer)local_b0._M_allocated_capacity;
      ((jVar8.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)local_b0._8_8_;
    }
    else {
      ((jVar8.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)local_c0;
      ((jVar8.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b0._M_allocated_capacity;
    }
    ((jVar8.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_b8;
    goto LAB_00147b14;
  case value_unsigned:
    result->m_type = number_unsigned;
    jVar8 = (json_value)(this->m_lexer).value_unsigned;
    goto LAB_00147b14;
  case value_integer:
    result->m_type = number_integer;
    jVar8 = (json_value)(this->m_lexer).value_integer;
LAB_00147b14:
    result->m_value = jVar8;
    break;
  case value_float:
    result->m_type = number_float;
    nVar4 = (this->m_lexer).value_float;
    (result->m_value).number_unsigned = (number_unsigned_t)nVar4;
    if (0x7fefffffffffffff < (ulong)ABS(nVar4)) {
      if (this->allow_exceptions == true) {
        __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
        lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::get_token_string((string *)local_68,&this->m_lexer);
        std::operator+(&local_90,"number overflow parsing \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_c0 = (undefined1  [8])*plVar11;
        psVar13 = (size_type *)(plVar11 + 2);
        if (local_c0 == (undefined1  [8])psVar13) {
          local_b0._M_allocated_capacity = *psVar13;
          local_b0._8_8_ = plVar11[3];
          local_c0 = (undefined1  [8])(local_c0 + 0x10);
        }
        else {
          local_b0._M_allocated_capacity = *psVar13;
        }
        local_b8 = *(json_value *)(plVar11 + 1);
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        out_of_range::create(__return_storage_ptr__,0x196,(string *)local_c0);
        __cxa_throw(__return_storage_ptr__,&out_of_range::typeinfo,exception::~exception);
      }
      if (this->last_token != uninitialized) {
        this->errored = true;
        this->expected = uninitialized;
      }
    }
    break;
  case begin_array:
    if (keep) {
      if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        keep = true;
      }
      else {
        local_c0._0_4_ = this->depth;
        this->depth = local_c0._0_4_ + 1;
        local_90._M_dataplus._M_p._0_1_ = 2;
        keep = (*(this->callback)._M_invoker)
                         ((_Any_data *)&this->callback,(int *)local_c0,(parse_event_t *)&local_90,
                          result);
        if ((!keep) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
        goto LAB_00147e85;
      }
      result->m_type = array;
      paVar10 = (array_t *)operator_new(0x18);
      (paVar10->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (paVar10->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (paVar10->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (result->m_value).array = paVar10;
    }
    else {
      keep = false;
    }
LAB_00147e85:
    plVar3 = &this->m_lexer;
    tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(plVar3);
    this->last_token = tVar7;
    if (tVar7 != end_array) {
      local_c0 = (undefined1  [8])((ulong)local_c0 & 0xffffffffffffff00);
      local_b8.object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_c0);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_c0);
      local_98 = (json_value *)&result->m_value;
      local_9c = (uint)keep;
      do {
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_c0 + 8),(value_t)local_c0[0]);
        local_c0[0] = (string)0x8;
        parse_internal(this,SUB41(local_9c,0),
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_c0);
        if (this->errored == true) {
LAB_00148032:
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_c0);
          return;
        }
        if ((keep != false) && (local_c0[0] != (string)0x8)) {
          std::
          vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
          ::
          emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                    (*(vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                       **)local_98,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_c0);
        }
        tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(plVar3);
        this->last_token = tVar7;
        if (tVar7 != value_separator) {
          if (tVar7 == end_array) {
            if ((keep != false) &&
               ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
              iVar14 = this->depth + -1;
              this->depth = iVar14;
              bVar6 = std::
                      function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                      ::operator()(&this->callback,iVar14,array_end,result);
              if (!bVar6) {
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::json_value::destroy(local_98,result->m_type);
                result->m_type = discarded;
              }
            }
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_c0);
            goto switchD_00147912_caseD_10;
          }
          this->errored = true;
          this->expected = end_array;
          if (this->allow_exceptions == true) {
            throw_exception(this);
          }
          goto LAB_00148032;
        }
        tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::scan(plVar3);
        this->last_token = tVar7;
      } while( true );
    }
    if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) break;
    iVar14 = this->depth + -1;
    this->depth = iVar14;
    local_c0._0_4_ = iVar14;
    local_90._M_dataplus._M_p._0_1_ = 3;
    bVar6 = (*(this->callback)._M_invoker)
                      ((_Any_data *)&this->callback,(int *)local_c0,(parse_event_t *)&local_90,
                       result);
    goto LAB_00147ec3;
  case begin_object:
    if (keep) {
      if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        keep = true;
      }
      else {
        local_c0._0_4_ = this->depth;
        this->depth = local_c0._0_4_ + 1;
        local_90._M_dataplus._M_p = (pointer)((ulong)local_90._M_dataplus._M_p._1_7_ << 8);
        keep = (*(this->callback)._M_invoker)
                         ((_Any_data *)&this->callback,(int *)local_c0,(parse_event_t *)&local_90,
                          result);
        if ((!keep) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0))
        goto LAB_00147b8c;
      }
      result->m_type = object;
      poVar9 = (object_t *)operator_new(0x30);
      p_Var2 = &(poVar9->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined1 (*) [16])&(poVar9->_M_t)._M_impl = (undefined1  [16])0x0;
      (poVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (poVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      (poVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      (poVar9->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      (result->m_value).object = poVar9;
    }
    else {
      keep = false;
    }
LAB_00147b8c:
    plVar3 = &this->m_lexer;
    tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::scan(plVar3);
    this->last_token = tVar7;
    if (tVar7 != end_object) {
      local_c0 = (undefined1  [8])(local_c0 + 0x10);
      local_b8.object = (object_t *)0x0;
      local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
      local_68[0] = null;
      local_60.object = (object_t *)0x0;
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_68);
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_68);
      if (this->last_token == value_string) {
        local_38 = &(this->m_lexer).yytext.field_2;
        local_48 = (_Any_data *)&this->callback;
        local_98 = (json_value *)(CONCAT71(local_98._1_7_,keep) ^ 1);
        local_40 = (json_value *)&result->m_value;
        local_9c = (uint)keep;
        do {
          local_90._M_dataplus._M_p = (this->m_lexer).yytext._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p == local_38) {
            local_90.field_2._M_allocated_capacity = local_38->_M_allocated_capacity;
            local_90.field_2._8_8_ = *(undefined8 *)((long)local_38 + 8);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = local_38->_M_allocated_capacity;
          }
          local_90._M_string_length = (this->m_lexer).yytext._M_string_length;
          (this->m_lexer).yytext._M_dataplus._M_p = (pointer)local_38;
          (this->m_lexer).yytext._M_string_length = 0;
          (this->m_lexer).yytext.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::operator=((string *)local_c0,(string *)&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          bVar6 = true;
          if (keep != false) {
            if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
              bVar6 = false;
            }
            else {
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)&local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
              local_6c = this->depth;
              local_c1 = key;
              if ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              bVar6 = (*(this->callback)._M_invoker)
                                (local_48,&local_6c,&local_c1,
                                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)&local_90);
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)&local_90);
              bVar6 = !bVar6;
            }
          }
          tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(plVar3);
          this->last_token = tVar7;
          if (tVar7 != name_separator) {
            this->errored = true;
            this->expected = name_separator;
            bVar5 = true;
            if (this->allow_exceptions == true) {
LAB_0014805f:
              throw_exception(this);
            }
            goto LAB_00147e2c;
          }
          tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(plVar3);
          this->last_token = tVar7;
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_68 + 8),local_68[0]);
          local_68[0] = discarded;
          parse_internal(this,SUB41(local_9c,0),
                         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_68);
          bVar5 = true;
          if (this->errored != false) goto LAB_00147e2c;
          if ((!bVar6 && (char)local_98 == '\0') && (local_68[0] != discarded)) {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
            ::
            _M_emplace_unique<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                      (*(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                         **)local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_68);
          }
          tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(plVar3);
          this->last_token = tVar7;
          if (tVar7 != value_separator) {
            if (tVar7 == end_object) {
              bVar5 = false;
              if ((keep != false) &&
                 (bVar5 = false,
                 (this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
                iVar14 = this->depth + -1;
                this->depth = iVar14;
                bVar6 = std::
                        function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                        ::operator()((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                                      *)local_48,iVar14,object_end,result);
                if (!bVar6) {
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::json_value::destroy(local_40,result->m_type);
                  result->m_type = discarded;
                }
                bVar5 = false;
              }
            }
            else {
              this->errored = true;
              this->expected = end_object;
              if (this->allow_exceptions != false) goto LAB_0014805f;
            }
            goto LAB_00147e2c;
          }
          tVar7 = lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::scan(plVar3);
          this->last_token = tVar7;
        } while (tVar7 == value_string);
      }
      this->errored = true;
      this->expected = value_string;
      bVar5 = true;
      if (this->allow_exceptions == true) {
        throw_exception(this);
      }
LAB_00147e2c:
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_68);
      if (local_c0 != (undefined1  [8])(local_c0 + 0x10)) {
        operator_delete((void *)local_c0,(ulong)(local_b0._M_allocated_capacity + 1));
      }
      if (bVar5) {
        return;
      }
      break;
    }
    if ((keep == false) || ((this->callback).super__Function_base._M_manager == (_Manager_type)0x0))
    break;
    iVar14 = this->depth + -1;
    this->depth = iVar14;
    bVar6 = std::
            function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
            ::operator()(&this->callback,iVar14,object_end,result);
LAB_00147ec3:
    if (bVar6 == false) {
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&(result->m_value).boolean,result->m_type);
      result->m_type = discarded;
    }
    break;
  default:
    this->errored = true;
    this->expected = literal_or_value;
    goto LAB_00147a30;
  case parse_error:
    this->errored = true;
    this->expected = uninitialized;
LAB_00147a30:
    if (this->allow_exceptions != true) {
      return;
    }
    throw_exception(this);
  case literal_or_value:
    break;
  }
switchD_00147912_caseD_10:
  if ((keep != false) && ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_c0._0_4_ = this->depth;
    local_90._M_dataplus._M_p._0_1_ = 5;
    bVar6 = (*(this->callback)._M_invoker)
                      ((_Any_data *)&this->callback,(int *)local_c0,(parse_event_t *)&local_90,
                       result);
    if (!bVar6) {
      result->m_type = discarded;
    }
  }
  return;
}

Assistant:

void parse_internal(bool keep, BasicJsonType& result)
    {
        // never parse after a parse error was detected
        assert(not errored);

        // start with a discarded value
        if (not result.is_discarded())
        {
            result.m_value.destroy(result.m_type);
            result.m_type = value_t::discarded;
        }

        switch (last_token)
        {
            case token_type::begin_object:
            {
                if (keep)
                {
                    if (callback)
                    {
                        keep = callback(depth++, parse_event_t::object_start, result);
                    }

                    if (not callback or keep)
                    {
                        // explicitly set result to object to cope with {}
                        result.m_type = value_t::object;
                        result.m_value = value_t::object;
                    }
                }

                // read next token
                get_token();

                // closing } -> we are done
                if (last_token == token_type::end_object)
                {
                    if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                    {
                        result.m_value.destroy(result.m_type);
                        result.m_type = value_t::discarded;
                    }
                    break;
                }

                // parse values
                std::string key;
                BasicJsonType value;
                while (true)
                {
                    // store key
                    if (not expect(token_type::value_string))
                    {
                        return;
                    }
                    key = m_lexer.move_string();

                    bool keep_tag = false;
                    if (keep)
                    {
                        if (callback)
                        {
                            BasicJsonType k(key);
                            keep_tag = callback(depth, parse_event_t::key, k);
                        }
                        else
                        {
                            keep_tag = true;
                        }
                    }

                    // parse separator (:)
                    get_token();
                    if (not expect(token_type::name_separator))
                    {
                        return;
                    }

                    // parse and add value
                    get_token();
                    value.m_value.destroy(value.m_type);
                    value.m_type = value_t::discarded;
                    parse_internal(keep, value);

                    if (JSON_UNLIKELY(errored))
                    {
                        return;
                    }

                    if (keep and keep_tag and not value.is_discarded())
                    {
                        result.m_value.object->emplace(std::move(key), std::move(value));
                    }

                    // comma -> next value
                    get_token();
                    if (last_token == token_type::value_separator)
                    {
                        get_token();
                        continue;
                    }

                    // closing }
                    if (not expect(token_type::end_object))
                    {
                        return;
                    }
                    break;
                }

                if (keep and callback and not callback(--depth, parse_event_t::object_end, result))
                {
                    result.m_value.destroy(result.m_type);
                    result.m_type = value_t::discarded;
                }
                break;
            }

            case token_type::begin_array:
            {
                if (keep)
                {
                    if (callback)
                    {
                        keep = callback(depth++, parse_event_t::array_start, result);
                    }

                    if (not callback or keep)
                    {
                        // explicitly set result to array to cope with []
                        result.m_type = value_t::array;
                        result.m_value = value_t::array;
                    }
                }

                // read next token
                get_token();

                // closing ] -> we are done
                if (last_token == token_type::end_array)
                {
                    if (callback and not callback(--depth, parse_event_t::array_end, result))
                    {
                        result.m_value.destroy(result.m_type);
                        result.m_type = value_t::discarded;
                    }
                    break;
                }

                // parse values
                BasicJsonType value;
                while (true)
                {
                    // parse value
                    value.m_value.destroy(value.m_type);
                    value.m_type = value_t::discarded;
                    parse_internal(keep, value);

                    if (JSON_UNLIKELY(errored))
                    {
                        return;
                    }

                    if (keep and not value.is_discarded())
                    {
                        result.m_value.array->push_back(std::move(value));
                    }

                    // comma -> next value
                    get_token();
                    if (last_token == token_type::value_separator)
                    {
                        get_token();
                        continue;
                    }

                    // closing ]
                    if (not expect(token_type::end_array))
                    {
                        return;
                    }
                    break;
                }

                if (keep and callback and not callback(--depth, parse_event_t::array_end, result))
                {
                    result.m_value.destroy(result.m_type);
                    result.m_type = value_t::discarded;
                }
                break;
            }

            case token_type::literal_null:
            {
                result.m_type = value_t::null;
                break;
            }

            case token_type::value_string:
            {
                result.m_type = value_t::string;
                result.m_value = m_lexer.move_string();
                break;
            }

            case token_type::literal_true:
            {
                result.m_type = value_t::boolean;
                result.m_value = true;
                break;
            }

            case token_type::literal_false:
            {
                result.m_type = value_t::boolean;
                result.m_value = false;
                break;
            }

            case token_type::value_unsigned:
            {
                result.m_type = value_t::number_unsigned;
                result.m_value = m_lexer.get_number_unsigned();
                break;
            }

            case token_type::value_integer:
            {
                result.m_type = value_t::number_integer;
                result.m_value = m_lexer.get_number_integer();
                break;
            }

            case token_type::value_float:
            {
                result.m_type = value_t::number_float;
                result.m_value = m_lexer.get_number_float();

                // throw in case of infinity or NAN
                if (JSON_UNLIKELY(not std::isfinite(result.m_value.number_float)))
                {
                    if (allow_exceptions)
                    {
                        JSON_THROW(out_of_range::create(406, "number overflow parsing '" +
                                                        m_lexer.get_token_string() + "'"));
                    }
                    expect(token_type::uninitialized);
                }
                break;
            }

            case token_type::parse_error:
            {
                // using "uninitialized" to avoid "expected" message
                if (not expect(token_type::uninitialized))
                {
                    return;
                }
                break; // LCOV_EXCL_LINE
            }

            default:
            {
                // the last token was unexpected; we expected a value
                if (not expect(token_type::literal_or_value))
                {
                    return;
                }
                break; // LCOV_EXCL_LINE
            }
        }

        if (keep and callback and not callback(depth, parse_event_t::value, result))
        {
            result.m_type = value_t::discarded;
        }
    }